

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::add_packed_svarint<int_const*>
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this,pbf_tag_type tag,int *first,
          int *last)

{
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> sw;
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> local_38;
  
  if (first != last) {
    local_38.m_data = this->m_data;
    local_38.m_rollback_pos = 0;
    local_38.m_pos = 0;
    local_38.m_parent_writer = this;
    open_submessage(this,tag,0);
    for (; first != last; first = first + 1) {
      add_varint(&local_38,(long)*first >> 0x3f ^ (long)*first * 2);
    }
    ~basic_pbf_writer(&local_38);
  }
  return;
}

Assistant:

void add_packed_svarint(pbf_tag_type tag, It first, It last) { // NOLINT(performance-unnecessary-value-param)
        if (first == last) {
            return;
        }

        basic_pbf_writer sw{*this, tag};

        while (first != last) {
            sw.add_varint(encode_zigzag64(*first++));
        }
    }